

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

void cmdq_release(void)

{
  int local_c;
  wchar_t i;
  
  cmdq_flush();
  for (local_c = 0; local_c < 0x14; local_c = local_c + 1) {
    cmd_release(cmd_queue + local_c);
  }
  cmd_release(&last_command);
  last_command.code = CMD_NULL;
  last_command_idx = L'\xffffffff';
  return;
}

Assistant:

void cmdq_release(void)
{
	int i;

	cmdq_flush();
	for (i = 0; i < CMD_QUEUE_SIZE; ++i) {
		cmd_release(cmd_queue + i);
	}
	cmd_release(&last_command);
	last_command.code = CMD_NULL;
	last_command_idx = -1;
}